

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

Vec_Int_t * Gia_ManBfsForCrossCut(Gia_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Vec_t *__ptr;
  int iVar7;
  long lVar8;
  long lVar9;
  
  iVar1 = p->nObjs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar7;
  if (iVar7 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar7 << 2);
  }
  p_00->pArray = piVar6;
  __ptr = Gia_ManLevelize(p);
  if (__ptr->nSize < 1) {
    bVar5 = false;
  }
  else {
    lVar9 = 0;
    do {
      pvVar2 = __ptr->pArray[lVar9];
      if (0 < *(int *)((long)pvVar2 + 4)) {
        lVar8 = 0;
        do {
          pGVar3 = *(Gia_Obj_t **)(*(long *)((long)pvVar2 + 8) + lVar8 * 8);
          pGVar4 = p->pObjs;
          if ((pGVar3 < pGVar4) || (pGVar4 + p->nObjs <= pGVar3)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00,(int)((ulong)((long)pGVar3 - (long)pGVar4) >> 2) * -0x55555555);
          lVar8 = lVar8 + 1;
        } while (lVar8 < *(int *)((long)pvVar2 + 4));
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < __ptr->nSize);
    bVar5 = 0 < __ptr->nSize;
  }
  if (bVar5) {
    lVar9 = 0;
    do {
      pvVar2 = __ptr->pArray[lVar9];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
          *(undefined8 *)((long)pvVar2 + 8) = 0;
        }
        free(pvVar2);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Vec_t *)0x0) {
    free(__ptr);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManBfsForCrossCut( Gia_Man_t * p )
{
    Vec_Int_t * vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Vec_Vec_t * vLevels = Gia_ManLevelize( p );
    Vec_Ptr_t * vObjs;
    Gia_Obj_t * pObj;
    int i, k;
    Vec_VecForEachLevel( vLevels, vObjs, i )
        Vec_PtrForEachEntry( Gia_Obj_t *, vObjs, pObj, k )
            Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
    Vec_VecFree( vLevels );
    return vNodes;
}